

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O3

void __thiscall soul::TaskThread::waitForThreadToFinish(TaskThread *this)

{
  pthread_t pVar1;
  
  pVar1 = pthread_self();
  if (pVar1 == (this->thread)._M_id._M_thread) {
    throwInternalCompilerError
              ("std::this_thread::get_id() != thread.get_id()","waitForThreadToFinish",0x37);
  }
  if ((this->shuttingDown).super___atomic_base<int>._M_i != 0) {
    if ((this->thread)._M_id._M_thread != 0) {
      std::thread::join();
      if ((this->thread)._M_id._M_thread != 0) {
        std::terminate();
      }
    }
    return;
  }
  throwInternalCompilerError("shuttingDown","waitForThreadToFinish",0x38);
}

Assistant:

void waitForThreadToFinish()
    {
        SOUL_ASSERT (std::this_thread::get_id() != thread.get_id());
        SOUL_ASSERT (shuttingDown);

        if (thread.joinable())
        {
            thread.join();
            thread = {};
        }
    }